

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_proj.c
# Opt level: O3

int CVodeGetNumProjEvals(void *cvode_mem,long *nproj)

{
  int iVar1;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  CVodeProjMem local_18;
  CVodeMem local_10;
  
  iVar1 = cvAccessProjMem(cvode_mem,"CVodeGetNumProjEvals",&local_10,&local_18);
  if (iVar1 == 0) {
    *nproj = local_18->nproj;
  }
  return iVar1;
}

Assistant:

int CVodeGetNumProjEvals(void* cvode_mem, long int* nproj)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Get number of projection evaluations */
  *nproj = proj_mem->nproj;

  return (CV_SUCCESS);
}